

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O1

void __thiscall
JointActionDiscrete::JointActionDiscrete(JointActionDiscrete *this,JointActionDiscrete *o)

{
  pointer *pppAVar1;
  pointer ppAVar2;
  iterator __position;
  pointer ppAVar3;
  ActionDiscrete *t;
  ActionDiscrete *local_38;
  
  (this->super_JointAction)._vptr_JointAction = (_func_int **)&PTR__JointAction_005cfec8;
  (this->super_DiscreteEntity)._vptr_DiscreteEntity = (_func_int **)&PTR__DiscreteEntity_005cff10;
  (this->super_DiscreteEntity)._m_index = (o->super_DiscreteEntity)._m_index;
  (this->super_JointAction)._vptr_JointAction = (_func_int **)&PTR__JointActionDiscrete_005cfe08;
  (this->super_DiscreteEntity)._vptr_DiscreteEntity =
       (_func_int **)&PTR__JointActionDiscrete_005cfe50;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_aIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_apVector).
  super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppAVar3 = (o->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (o->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar2) {
    do {
      local_38 = *ppAVar3;
      __position._M_current =
           (this->_m_apVector).
           super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_m_apVector).
          super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ActionDiscrete_const*,std::allocator<ActionDiscrete_const*>>::
        _M_realloc_insert<ActionDiscrete_const*const&>
                  ((vector<ActionDiscrete_const*,std::allocator<ActionDiscrete_const*>> *)
                   &this->_m_apVector,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppAVar1 = &(this->_m_apVector).
                    super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
      ppAVar3 = ppAVar3 + 1;
    } while (ppAVar3 != ppAVar2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->_m_aIndexVector,&o->_m_aIndexVector);
  return;
}

Assistant:

JointActionDiscrete::JointActionDiscrete(const JointActionDiscrete& o) :
    DiscreteEntity(o)
{    
if(DEBUG_JAD)   cout << " cloning joint action ";

    vector<const ActionDiscrete*>::const_iterator itp = o._m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator lastp = o._m_apVector.end();
    while(itp != lastp)
    {
        const ActionDiscrete* t = *itp;
        _m_apVector.push_back(t);
        itp++;
    }
    _m_aIndexVector = o._m_aIndexVector;
}